

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O0

void __thiscall
wasm::ParallelFuncCastEmulation::visitCallIndirect
          (ParallelFuncCastEmulation *this,CallIndirect *curr)

{
  Type type;
  CallIndirect *value;
  bool bVar1;
  size_t sVar2;
  Fatal *this_00;
  ExpressionList *pEVar3;
  Expression **ppEVar4;
  Module *pMVar5;
  Expression *pEVar6;
  Type local_200;
  Type local_1f8;
  Type oldType;
  Expression **operand;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  Fatal local_1a0;
  CallIndirect *local_18;
  CallIndirect *curr_local;
  ParallelFuncCastEmulation *this_local;
  
  local_18 = curr;
  curr_local = (CallIndirect *)this;
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->operands).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (sVar2 <= this->numParams) {
    pEVar3 = &local_18->operands;
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&pEVar3->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _operand = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&pEVar3->
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end2.index,(Iterator *)&operand), bVar1) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end2.index);
      pEVar6 = *ppEVar4;
      pMVar5 = Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                            ).
                            super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                            .
                            super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                          );
      pEVar6 = toABI(pEVar6,pMVar5);
      *ppEVar4 = pEVar6;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end2.index);
    }
    while (sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                             (&(local_18->operands).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ), sVar2 < this->numParams) {
      pEVar3 = &local_18->operands;
      wasm::Type::Type(&oldType,i64);
      pMVar5 = Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                            ).
                            super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                            .
                            super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                          );
      pEVar6 = LiteralUtils::makeZero(oldType,pMVar5);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,pEVar6);
    }
    (local_18->heapType).id = (this->ABIType).id;
    local_1f8.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.
                   type.id;
    wasm::Type::Type(&local_200,i64);
    (local_18->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id =
         local_200.id;
    CallIndirect::finalize(local_18);
    value = local_18;
    type.id = local_1f8.id;
    pMVar5 = Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                          ).
                          super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                          .
                          super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                        );
    pEVar6 = fromABI((Expression *)value,type,pMVar5);
    Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>::
    replaceCurrent(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                    ).
                    super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                    .
                    super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                   ,pEVar6);
    return;
  }
  Fatal::Fatal(&local_1a0);
  this_00 = Fatal::operator<<(&local_1a0,(char (*) [38])"max-func-params needs to be at least ");
  __range2 = (ExpressionList *)
             ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(local_18->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
  ;
  Fatal::operator<<(this_00,(unsigned_long *)&__range2);
  Fatal::~Fatal(&local_1a0);
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->operands.size() > numParams) {
      Fatal() << "max-func-params needs to be at least "
              << curr->operands.size();
    }
    for (Expression*& operand : curr->operands) {
      operand = toABI(operand, getModule());
    }
    // Add extra operands as needed.
    while (curr->operands.size() < numParams) {
      curr->operands.push_back(LiteralUtils::makeZero(Type::i64, *getModule()));
    }
    // Set the new types
    curr->heapType = ABIType;
    auto oldType = curr->type;
    curr->type = Type::i64;
    curr->finalize(); // may be unreachable
    // Fix up return value
    replaceCurrent(fromABI(curr, oldType, getModule()));
  }